

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int print_lda(char *fn)

{
  int32 iVar1;
  uint32 local_48;
  uint32 local_44;
  uint32 chksum;
  uint32 swap;
  uint32 k;
  uint32 j;
  uint32 i;
  uint32 n;
  uint32 m;
  uint32 n_lda;
  float32 ***lda;
  FILE *fh;
  char *fn_local;
  
  fh = (FILE *)fn;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/printp/main.c"
          ,0x88,"Reading %s\n",fn);
  lda = (float32 ***)s3open((char *)fh,"rb",&local_44);
  if ((FILE *)lda == (FILE *)0x0) {
    fn_local._4_4_ = -1;
  }
  else {
    iVar1 = bio_fread_3d((void ****)&m,4,&n,&i,&j,(FILE *)lda,local_44,&local_48);
    if (iVar1 < 0) {
      fn_local._4_4_ = -1;
    }
    else {
      printf("lda %u %u %u\n",(ulong)n,(ulong)i,(ulong)j);
      for (k = 0; k < n; k = k + 1) {
        printf("lda %u\n",(ulong)k);
        for (swap = 0; swap < i; swap = swap + 1) {
          for (chksum = 0; chksum < j; chksum = chksum + 1) {
            printf("%e ",(double)*(float *)((long)_m[k][swap] + (ulong)chksum * 4));
          }
          printf("\n");
        }
        printf("\n");
      }
      fn_local._4_4_ = 0;
    }
  }
  return fn_local._4_4_;
}

Assistant:

int
print_lda(const char *fn)
{
    FILE *fh;
    float32 ***lda;
    uint32 n_lda, m, n;
    uint32 i, j, k, swap, chksum;

    E_INFO("Reading %s\n",  fn);
    
    if ((fh = s3open(fn, "rb", &swap)) == NULL)
	return S3_ERROR;
    if (bio_fread_3d((void ****)&lda, sizeof(float32),
		  &n_lda, &m, &n, fh, swap, &chksum) < 0)
	return S3_ERROR;

    printf("lda %u %u %u\n", n_lda, m, n);

    for (i = 0; i < n_lda; i++) {
	printf("lda %u\n", i);
	for (j = 0; j < m; j++) {
	    for (k = 0; k < n; k++) {
		printf("%e ", lda[i][j][k]);
	    }
	    printf("\n");
	}
	printf("\n");
    }
    return S3_SUCCESS;
}